

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::membrane
          (anon_unknown_0 *this,Own<capnp::ClientHook> *inner,MembranePolicy *policy,bool reverse)

{
  Disposer *pDVar1;
  ClientHook *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  long *plVar5;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *extraout_RDX_04;
  ClientHook *pCVar6;
  ClientHook *extraout_RDX_05;
  ClientHook *extraout_RDX_06;
  ClientHook *extraout_RDX_07;
  ClientHook *extraout_RDX_08;
  ClientHook *extraout_RDX_09;
  ClientHook *pCVar7;
  Own<capnp::ClientHook> OVar8;
  Disposer *local_60;
  ClientHook *local_58;
  Disposer *local_50;
  ClientHook *local_48;
  Disposer *local_40;
  ClientHook *local_38;
  undefined4 extraout_var_00;
  
  pDVar1 = inner->disposer;
  pCVar7 = inner->ptr;
  inner->ptr = (ClientHook *)0x0;
  iVar3 = (*pCVar7->_vptr_ClientHook[5])(pCVar7);
  if ((undefined1 *)CONCAT44(extraout_var,iVar3) == &(anonymous_namespace)::DUMMY) {
    iVar3 = (*policy->_vptr_MembranePolicy[6])(policy);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
    plVar5 = (long *)(**(code **)(*pCVar7[6]._vptr_ClientHook + 0x30))();
    if ((plVar5 == plVar4) && ((bool)*(char *)&pCVar7[7]._vptr_ClientHook == !reverse)) {
      (**(code **)(*pCVar7[4]._vptr_ClientHook + 0x20))(&local_60);
      if (reverse) {
        local_40 = local_60;
        local_38 = local_58;
        (**(code **)(*plVar4 + 0x38))(&local_60,plVar4,&local_40,pCVar7[6]._vptr_ClientHook,policy);
        pCVar6 = extraout_RDX;
      }
      else {
        local_50 = local_60;
        local_48 = local_58;
        (**(code **)(*plVar4 + 0x40))(&local_60,plVar4,&local_50,pCVar7[6]._vptr_ClientHook,policy);
        pCVar6 = extraout_RDX_06;
      }
      pCVar2 = local_48;
      *(Disposer **)this = local_60;
      *(ClientHook **)(this + 8) = local_58;
      local_58 = (ClientHook *)0x0;
      if (!reverse) {
        if (local_48 != (ClientHook *)0x0) {
          local_48 = (ClientHook *)0x0;
          (**local_50->_vptr_Disposer)
                    (local_50,pCVar2->_vptr_ClientHook[-2] + (long)&pCVar2->_vptr_ClientHook);
          pCVar6 = extraout_RDX_07;
        }
        if (!reverse) goto LAB_003b62f3;
      }
      pCVar2 = local_58;
      if (local_58 != (ClientHook *)0x0) {
        local_58 = (ClientHook *)0x0;
        (**local_60->_vptr_Disposer)(local_60,(long)pCVar2 + *(long *)(*(long *)pCVar2 + -0x10));
        pCVar6 = extraout_RDX_08;
      }
      pCVar2 = local_38;
      if ((reverse) && (local_38 != (ClientHook *)0x0)) {
        local_38 = (ClientHook *)0x0;
        (**local_40->_vptr_Disposer)
                  (local_40,pCVar2->_vptr_ClientHook[-2] + (long)&pCVar2->_vptr_ClientHook);
        pCVar6 = extraout_RDX_09;
      }
      goto LAB_003b62f3;
    }
  }
  if (reverse) {
    local_40 = pDVar1;
    local_38 = pCVar7;
    (*policy->_vptr_MembranePolicy[4])(&local_60,policy);
    pCVar6 = extraout_RDX_00;
  }
  else {
    local_50 = pDVar1;
    local_48 = pCVar7;
    (*policy->_vptr_MembranePolicy[5])(&local_60,policy);
    pCVar6 = extraout_RDX_01;
  }
  pCVar7 = local_48;
  *(Disposer **)this = local_60;
  *(ClientHook **)(this + 8) = local_58;
  local_58 = (ClientHook *)0x0;
  if (reverse) {
LAB_003b629b:
    pCVar7 = local_58;
    if (local_58 != (ClientHook *)0x0) {
      local_58 = (ClientHook *)0x0;
      (**local_60->_vptr_Disposer)(local_60,(long)pCVar7 + *(long *)(*(long *)pCVar7 + -0x10));
      pCVar6 = extraout_RDX_03;
    }
    pCVar2 = local_38;
    if ((reverse) && (local_38 != (ClientHook *)0x0)) {
      local_38 = (ClientHook *)0x0;
      pCVar7 = (ClientHook *)0x0;
      (**local_40->_vptr_Disposer)
                (local_40,pCVar2->_vptr_ClientHook[-2] + (long)&pCVar2->_vptr_ClientHook);
      pCVar6 = extraout_RDX_04;
      goto LAB_003b62f3;
    }
  }
  else {
    if (local_48 != (ClientHook *)0x0) {
      local_48 = (ClientHook *)0x0;
      (**local_50->_vptr_Disposer)
                (local_50,pCVar7->_vptr_ClientHook[-2] + (long)&pCVar7->_vptr_ClientHook);
      pCVar6 = extraout_RDX_02;
    }
    if (reverse) goto LAB_003b629b;
  }
  pCVar7 = (ClientHook *)0x0;
LAB_003b62f3:
  if (pCVar7 != (ClientHook *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pCVar7->_vptr_ClientHook[-2] + (long)&pCVar7->_vptr_ClientHook);
    pCVar6 = extraout_RDX_05;
  }
  OVar8.ptr = pCVar6;
  OVar8.disposer = (Disposer *)this;
  return OVar8;
}

Assistant:

kj::Own<ClientHook> membrane(kj::Own<ClientHook> inner, MembranePolicy& policy, bool reverse) {
  return MembraneHook::wrap(kj::mv(inner), policy, reverse);
}